

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::parameter::add_flags<std::__cxx11::string,char_const(&)[11]>
          (parameter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
          char (*s2) [11])

{
  char (*__s) [11];
  allocator<char> local_71;
  arg_string local_70;
  arg_string local_40;
  char (*local_20) [11];
  char (*s2_local) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1_local;
  parameter *this_local;
  
  local_20 = s2;
  s2_local = (char (*) [11])s1;
  s1_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->flags_,2);
  std::__cxx11::string::string((string *)&local_40,(string *)s2_local);
  add_flags(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,*__s,&local_71);
  add_flags(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void
    add_flags(String1&& s1, String2&& s2, Strings&&... ss) {
        flags_.reserve(2 + sizeof...(ss));
        add_flags(std::forward<String1>(s1));
        add_flags(std::forward<String2>(s2), std::forward<Strings>(ss)...);
    }